

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall
Clasp::Solver::postPropagate(Solver *this,PostPropagator **start,PostPropagator *stop)

{
  char cVar1;
  PostPropagator *pPVar3;
  int iVar2;
  
  pPVar3 = *start;
  if (pPVar3 == stop) {
    cVar1 = '\x01';
  }
  else {
    do {
      iVar2 = (*(pPVar3->super_Constraint)._vptr_Constraint[0x14])(pPVar3,this,stop);
      cVar1 = (char)iVar2;
      if (cVar1 == '\0') {
        return false;
      }
      if (pPVar3 == *start) {
        start = &pPVar3->next;
      }
      pPVar3 = *start;
    } while (pPVar3 != stop);
  }
  return (bool)cVar1;
}

Assistant:

bool Solver::postPropagate(PostPropagator** start, PostPropagator* stop) {
	for (PostPropagator** r = start, *t; *r != stop;) {
		t = *r;
		if (!t->propagateFixpoint(*this, stop)) { return false; }
		assert(queueSize() == 0);
		if (t == *r) { r = &t->next; }
		// else: t was removed during propagate
	}
	return true;
}